

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

uint32_t instr_get_size(thanm_instr_t *instr,int32_t version)

{
  list_node_t *local_28;
  list_node_t *node;
  thanm_param_t *param;
  uint32_t size;
  int32_t version_local;
  thanm_instr_t *instr_local;
  
  param._0_4_ = 8;
  if (version == 0) {
    param._0_4_ = 4;
  }
  for (local_28 = (instr->params).head; local_28 != (list_node_t *)0x0; local_28 = local_28->next) {
    if (*local_28->data == 0x73) {
      param._0_4_ = (uint32_t)param + 2;
    }
    else {
      param._0_4_ = (uint32_t)param + 4;
    }
  }
  return (uint32_t)param;
}

Assistant:

uint32_t
instr_get_size(
    thanm_instr_t* instr,
    int32_t version
) {
    uint32_t size = version == 0 ? sizeof(anm_instr0_t) : sizeof(anm_instr_t);
    thanm_param_t* param;
    list_for_each(&instr->params, param) {
        switch(param->type) {
            case 's':
                size += sizeof(int16_t);
                break;
            default:
                size += 4;
        }
    }

    return size;
}